

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *enumNode)

{
  ListElementCount LVar1;
  ulong uVar2;
  uint uVar3;
  byte bVar4;
  ElementCount EVar5;
  ulong __n;
  bool *__s;
  ElementCount index;
  bool bVar6;
  Array<bool> sawCodeOrder_heap;
  Fault f;
  ArrayPtr<const_char> local_f0;
  ElementCount local_e0;
  undefined4 uStack_dc;
  int local_d8;
  Reader enumerant;
  anon_class_8_1_6f242a07 local_a0;
  anon_class_16_2_3f8e8a0c local_98;
  Reader enumerants;
  bool sawCodeOrder_stack [32];
  
  if ((enumNode->_reader).pointerCount < 4) {
    enumerant._reader.pointers._0_4_ = 0x7fffffff;
    enumerant._reader.capTable = (CapTableReader *)0x0;
    enumerant._reader.data = (WirePointer *)0x0;
    enumerant._reader.segment = (SegmentReader *)0x0;
  }
  else {
    enumerant._reader.segment = (enumNode->_reader).segment;
    enumerant._reader.capTable = (enumNode->_reader).capTable;
    enumerant._reader.data = (enumNode->_reader).pointers + 3;
    enumerant._reader.pointers._0_4_ = (enumNode->_reader).nestingLimit;
  }
  _::PointerReader::getList
            (&enumerants.reader,(PointerReader *)&enumerant,INLINE_COMPOSITE,(word *)0x0);
  LVar1 = enumerants.reader.elementCount;
  uVar2 = (ulong)enumerants.reader.elementCount;
  if (uVar2 < 0x21) {
    sawCodeOrder_heap.ptr = (bool *)0x0;
    sawCodeOrder_heap.size_ = 0;
    sawCodeOrder_heap.disposer = (ArrayDisposer *)0x0;
  }
  else {
    sawCodeOrder_heap.ptr =
         (bool *)kj::_::HeapArrayDisposer::allocateImpl
                           (1,uVar2,uVar2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    sawCodeOrder_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    sawCodeOrder_heap.size_ = uVar2;
  }
  __n = sawCodeOrder_heap.size_;
  __s = sawCodeOrder_heap.ptr;
  if (LVar1 < 0x21) {
    __n = uVar2;
    __s = sawCodeOrder_stack;
  }
  index = 0;
  memset(__s,0,__n);
  if (enumerants.reader.elementCount != 0) {
    EVar5 = enumerants.reader.elementCount - 1;
    do {
      _::ListReader::getStructElement(&enumerant._reader,&enumerants.reader,index);
      local_f0.size_ = (size_t)enumerant._reader.capTable;
      local_f0.ptr = (char *)enumerant._reader.segment;
      local_d8 = enumerant._reader.nestingLimit;
      local_e0 = (int)enumerant._reader.pointers;
      uStack_dc = enumerant._reader.pointers._4_4_;
      if (enumerant._reader.pointerCount == 0) {
        local_e0 = 0;
        uStack_dc = 0;
        local_f0.size_ = (size_t)(CapTableReader *)0x0;
        local_f0.ptr = (char *)(SegmentReader *)0x0;
        local_d8 = 0x7fffffff;
      }
      _f = (ArrayPtr<const_char>)
           _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_f0,(void *)0x0,0);
      _local_e0 = (WirePointer *)CONCAT44(uStack_dc,index);
      local_a0.update = &local_98;
      local_f0 = _f;
      local_98.name = (StringPtr *)&f;
      local_98.this = this;
      kj::
      Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
      ::
      upsert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::upsert<capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_>(capnp::Text::Reader,unsigned_int,capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_&&)::_lambda(kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&,kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&&)_1_>
                ((Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
                  *)&this->members,(Entry *)&local_f0,&local_a0);
      uVar3 = 0;
      if (0xf < enumerant._reader.dataSize) {
        uVar3 = (uint)*enumerant._reader.data;
      }
      if (uVar3 < enumerants.reader.elementCount) {
        if (enumerant._reader.dataSize < 0x10) {
          uVar2 = 0;
        }
        else {
          uVar2 = (ulong)*enumerant._reader.data;
        }
        bVar4 = __s[uVar2] ^ 1;
      }
      else {
        bVar4 = 0;
      }
      if (bVar4 == 0) {
        local_f0 = (ArrayPtr<const_char>)capnp::schema::Enumerant::Reader::getName(&enumerant);
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18],capnp::Text::Reader>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x1a2,FAILED,
                   "enumerant.getCodeOrder() < enumerants.size() && !sawCodeOrder[enumerant.getCodeOrder()]"
                   ,"\"invalid codeOrder\", enumerant.getName()",(char (*) [18])"invalid codeOrder",
                   (Reader *)&local_f0);
        this->isValid = false;
        kj::_::Debug::Fault::~Fault(&f);
      }
      else {
        if (enumerant._reader.dataSize < 0x10) {
          uVar2 = 0;
        }
        else {
          uVar2 = (ulong)*enumerant._reader.data;
        }
        __s[uVar2] = true;
      }
      bVar6 = EVar5 != index;
      index = index + 1;
    } while ((bVar4 & bVar6) != 0);
  }
  if (sawCodeOrder_heap.ptr != (bool *)0x0) {
    (*(code *)**(undefined8 **)sawCodeOrder_heap.disposer)
              (sawCodeOrder_heap.disposer,sawCodeOrder_heap.ptr,1,sawCodeOrder_heap.size_,
               sawCodeOrder_heap.size_,0,0,0);
  }
  return;
}

Assistant:

KJ_STACK_ARRAY(bool, sawCodeOrder, enumerants.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    uint index = 0;
    for (auto enumerant: enumerants) {
      validateMemberName(enumerant.getName(), index++);

      VALIDATE_SCHEMA(enumerant.getCodeOrder() < enumerants.size() &&
                      !sawCodeOrder[enumerant.getCodeOrder()],
                      "invalid codeOrder", enumerant.getName());
      sawCodeOrder[enumerant.getCodeOrder()] = true;
    }